

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_gethook(lua_State *L)

{
  byte bVar1;
  code *pcVar2;
  uint uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  bool bVar5;
  undefined3 uStack_18;
  char buff [5];
  
  uVar4 = (ulong)(L->glref).ptr32;
  bVar1 = *(byte *)(uVar4 + 0x91);
  pcVar2 = *(code **)(uVar4 + 0xd0);
  _uStack_18 = in_RAX;
  if (pcVar2 == hookf || pcVar2 == (code *)0x0) {
    lua_pushlightuserdata(L,"h");
    lua_rawget(L,-10000);
  }
  else {
    lua_pushlstring(L,"external hook",0xd);
  }
  bVar5 = (bVar1 & 1) != 0;
  if (bVar5) {
    _uStack_18 = CONCAT13(99,uStack_18);
  }
  uVar4 = (ulong)bVar5;
  if ((bVar1 & 2) != 0) {
    uVar4 = (ulong)(bVar5 + 1);
    buff[bVar5] = 'r';
  }
  uVar3 = (uint)uVar4;
  if ((bVar1 & 4) != 0) {
    uVar3 = uVar3 + 1;
    buff[uVar4] = 'l';
  }
  buff[uVar3] = '\0';
  lua_pushstring(L,buff);
  lua_pushinteger(L,(long)*(int *)((ulong)(L->glref).ptr32 + 0xcc));
  return 3;
}

Assistant:

LJLIB_CF(debug_gethook)
{
  char buff[5];
  int mask = lua_gethookmask(L);
  lua_Hook hook = lua_gethook(L);
  if (hook != NULL && hook != hookf) {  /* external hook? */
    lua_pushliteral(L, "external hook");
  } else {
    lua_pushlightuserdata(L, (void *)&KEY_HOOK);
    lua_rawget(L, LUA_REGISTRYINDEX);   /* get hook */
  }
  lua_pushstring(L, unmakemask(mask, buff));
  lua_pushinteger(L, lua_gethookcount(L));
  return 3;
}